

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::
DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::getValuePtr(DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              *this,TermList key,List<Saturation::ExtensionalityClause> ***pval,
             List<Saturation::ExtensionalityClause> **initial)

{
  Entry *pEVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RSI;
  TermList *in_RDI;
  bool bVar2;
  bool exists;
  Entry *e;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  TermList *key_00;
  
  key_00 = in_RDI;
  ensureExpanded((DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT17(in_stack_ffffffffffffffd7,
                             CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  pEVar1 = findEntryToInsert(in_RSI,key_00);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == (uint)in_RDI->_content) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == (uint)in_RDI->_content) {
      *(int *)&in_RDI[1]._content = (int)in_RDI[1]._content + -1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | (int)in_RDI->_content << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    (pEVar1->_key)._content = (uint64_t)in_RSI;
    pEVar1->_val = (List<Saturation::ExtensionalityClause> *)*in_RCX;
    *(int *)((long)&in_RDI->_content + 4) = *(int *)((long)&in_RDI->_content + 4) + 1;
  }
  *in_RDX = &pEVar1->_val;
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool getValuePtr(Key key, Val*& pval, const Val& initial)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      e->_val=initial;
      _size++;
    }
    pval=&e->_val;
    return !exists;
  }